

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall
cmMakefile::ListFileScope::ListFileScope(ListFileScope *this,cmMakefile *mf,string *filenametoread)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppcVar2;
  cmMakefile *pcVar3;
  bool bVar4;
  long entryPointLine;
  string name;
  string local_58;
  Snapshot local_38;
  
  this->Makefile = mf;
  this->ReportError = true;
  paVar1 = &local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  ppcVar2 = (mf->ContextStack).
            super__Vector_base<const_cmCommandContext_*,_std::allocator<const_cmCommandContext_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  if ((mf->ContextStack).
      super__Vector_base<const_cmCommandContext_*,_std::allocator<const_cmCommandContext_*>_>.
      _M_impl.super__Vector_impl_data._M_start == ppcVar2) {
    entryPointLine = 0;
  }
  else {
    entryPointLine = ppcVar2[-1]->Line;
    std::__cxx11::string::_M_assign((string *)&local_58);
  }
  cmState::CreateInlineListFileSnapshot
            (&local_38,this->Makefile->GlobalGenerator->CMakeInstance->State,
             this->Makefile->StateSnapshot,&local_58,entryPointLine,filenametoread);
  pcVar3 = this->Makefile;
  (pcVar3->StateSnapshot).Position.Position = local_38.Position.Position;
  (pcVar3->StateSnapshot).State = local_38.State;
  (pcVar3->StateSnapshot).Position.Tree = local_38.Position.Tree;
  bVar4 = cmState::Snapshot::IsValid(&this->Makefile->StateSnapshot);
  if (bVar4) {
    PushFunctionBlockerBarrier(this->Makefile);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                               local_58.field_2._M_local_buf[0]) + 1);
    }
    return;
  }
  __assert_fail("this->Makefile->StateSnapshot.IsValid()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmMakefile.cxx"
                ,0x1f7,"cmMakefile::ListFileScope::ListFileScope(cmMakefile *, const std::string &)"
               );
}

Assistant:

ListFileScope(cmMakefile* mf, std::string const& filenametoread)
    : Makefile(mf), ReportError(true)
  {
    long line = 0;
    std::string name;
    if (!this->Makefile->ContextStack.empty())
      {
      line = this->Makefile->ContextStack.back()->Line;
      name = this->Makefile->ContextStack.back()->Name;
      }
    this->Makefile->StateSnapshot =
        this->Makefile->GetState()->CreateInlineListFileSnapshot(
          this->Makefile->StateSnapshot, name, line, filenametoread);
    assert(this->Makefile->StateSnapshot.IsValid());

    this->Makefile->PushFunctionBlockerBarrier();
  }